

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unisetspan.cpp
# Opt level: O3

int32_t __thiscall
icu_63::UnicodeSetStringSpan::span
          (UnicodeSetStringSpan *this,UChar *s,int32_t length,USetSpanCondition spanCondition)

{
  UnicodeSet *this_00;
  UChar *pUVar1;
  byte bVar2;
  ushort uVar3;
  UChar UVar4;
  uint uVar5;
  uint uVar6;
  char cVar7;
  int32_t iVar8;
  uint uVar9;
  UBool *pUVar10;
  void *pvVar11;
  long lVar12;
  uint uVar13;
  long lVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  UChar *pUVar21;
  int iVar22;
  ulong uVar23;
  uint uVar24;
  long lVar25;
  uint uVar26;
  long lVar27;
  bool bVar28;
  OffsetList offsets;
  int local_b0;
  uint local_ac;
  uint local_a8;
  OffsetList local_68;
  long local_40;
  UChar *local_38;
  
  if (spanCondition == USET_SPAN_NOT_CONTAINED) {
    iVar8 = spanNot(this,s,length);
    return iVar8;
  }
  this_00 = &this->spanSet;
  local_ac = UnicodeSet::span(this_00,s,length,USET_SPAN_CONTAINED);
  local_b0 = length - local_ac;
  if (local_b0 == 0) {
    return length;
  }
  local_68.list = local_68.staticList;
  local_68.capacity = 0;
  local_68.length = 0;
  local_68.start = 0;
  if (spanCondition == USET_SPAN_CONTAINED) {
    iVar15 = this->maxLength16;
    if ((long)iVar15 < 0x11) {
      local_68.capacity = 0x10;
      local_68.length = 0;
      iVar15 = 0x10;
    }
    else {
      pUVar10 = (UBool *)uprv_malloc_63((long)iVar15);
      if (pUVar10 == (UBool *)0x0) {
        iVar15 = local_68.capacity;
      }
      else {
        local_68.capacity = iVar15;
        local_68.list = pUVar10;
      }
    }
    memset(local_68.list,0,(long)iVar15);
  }
  uVar5 = this->strings->count;
  local_40 = (long)length;
  local_a8 = local_ac;
  do {
    uVar16 = length;
    if (spanCondition == USET_SPAN_CONTAINED) {
      if (0 < (int)uVar5) {
        uVar23 = 0;
        do {
          bVar2 = this->spanLengths[uVar23];
          if (bVar2 != 0xff) {
            pvVar11 = UVector::elementAt(this->strings,(int32_t)uVar23);
            uVar3 = *(ushort *)((long)pvVar11 + 8);
            if ((uVar3 & 0x11) == 0) {
              if ((uVar3 & 2) == 0) {
                lVar12 = *(long *)((long)pvVar11 + 0x18);
              }
              else {
                lVar12 = (long)pvVar11 + 10;
              }
            }
            else {
              lVar12 = 0;
            }
            if ((short)uVar3 < 0) {
              uVar9 = *(uint *)((long)pvVar11 + 0xc);
            }
            else {
              uVar9 = (int)(short)uVar3 >> 5;
            }
            lVar14 = (long)(int)uVar9;
            uVar26 = (uint)bVar2;
            if ((((bVar2 == 0xfe) && (uVar26 = uVar9 - 1, 1 < (int)uVar9)) &&
                ((*(ushort *)(lVar12 + -2 + lVar14 * 2) & 0xfc00) == 0xdc00)) &&
               ((*(ushort *)(lVar12 + -4 + (ulong)uVar9 * 2) & 0xfc00) == 0xd800)) {
              uVar26 = uVar9 - 2;
            }
            uVar24 = local_ac;
            if ((int)uVar26 < (int)local_ac) {
              uVar24 = uVar26;
            }
            if ((int)(uVar9 - uVar24) <= local_b0) {
              if ((int)local_ac <= (int)uVar26) {
                uVar26 = local_ac;
              }
              lVar20 = (long)(int)uVar26;
              pUVar21 = s + ((int)local_a8 - lVar20);
              iVar15 = uVar9 - uVar24;
              do {
                iVar8 = local_68.capacity;
                if (local_68.start + iVar15 < local_68.capacity) {
                  iVar8 = 0;
                }
                iVar22 = (local_68.start + iVar15) - iVar8;
                if (local_68.list[iVar22] == '\0') {
                  lVar25 = (int)local_a8 - lVar20;
                  pUVar1 = s + lVar25;
                  lVar27 = 0;
                  iVar17 = uVar9 + 1;
                  do {
                    if (*(short *)((long)pUVar21 + lVar27) != *(short *)(lVar12 + lVar27))
                    goto LAB_002f07fa;
                    lVar27 = lVar27 + 2;
                    iVar17 = iVar17 + -1;
                  } while (1 < iVar17);
                  if ((((lVar25 < 1) || ((pUVar1[-1] & 0xfc00U) != 0xd800)) ||
                      ((*pUVar1 & 0xfc00U) != 0xdc00)) &&
                     (((local_40 - lVar14 <= lVar25 || ((pUVar1[lVar14 + -1] & 0xfc00U) != 0xd800))
                      || ((pUVar1[lVar14] & 0xfc00U) != 0xdc00)))) {
                    if (iVar15 == local_b0) goto LAB_002f0b9a;
                    local_68.list[iVar22] = '\x01';
                    local_68.length = local_68.length + 1;
                  }
                }
LAB_002f07fa:
                bVar28 = lVar20 == 0;
                lVar20 = lVar20 + -1;
                if (bVar28) break;
                pUVar21 = pUVar21 + 1;
                bVar28 = iVar15 != local_b0;
                iVar15 = iVar15 + 1;
              } while (bVar28);
            }
          }
          uVar23 = uVar23 + 1;
        } while (uVar23 != uVar5);
      }
LAB_002f0a5c:
      if ((local_ac == 0) && (local_a8 != 0)) {
        pUVar21 = s + (int)local_a8;
        if (local_68.length == 0) {
          uVar9 = UnicodeSet::span(this_00,pUVar21,local_b0,USET_SPAN_CONTAINED);
          local_b0 = local_b0 - uVar9;
          if ((local_b0 != 0) && (local_ac = uVar9, uVar9 != 0)) goto LAB_002f0b61;
          uVar16 = uVar9 + local_a8;
LAB_002f0b9a:
          OffsetList::~OffsetList(&local_68);
          return uVar16;
        }
        UVar4 = *pUVar21;
        if (((local_b0 < 2) || (((ushort)UVar4 & 0xfc00) != 0xd800)) ||
           (((ushort)pUVar21[1] & 0xfc00) != 0xdc00)) {
          cVar7 = UnicodeSet::contains(this_00,(uint)(ushort)UVar4);
          uVar9 = 1;
        }
        else {
          cVar7 = UnicodeSet::contains
                            (this_00,(uint)(ushort)UVar4 * 0x400 + (uint)(ushort)pUVar21[1] +
                                     -0x35fdc00);
          uVar9 = 2;
        }
        if (cVar7 == '\0') goto LAB_002f0ade;
        local_b0 = local_b0 - uVar9;
        if (local_b0 == 0) goto LAB_002f0b9a;
        iVar8 = local_68.capacity;
        if ((int)(local_68.start + uVar9) < local_68.capacity) {
          iVar8 = 0;
        }
        local_68.start = (local_68.start + uVar9) - iVar8;
        if (local_68.list[local_68.start] != '\0') {
          local_68.list[local_68.start] = '\0';
          local_68.length = local_68.length + -1;
        }
      }
      else {
        uVar16 = local_a8;
        if (local_68.length == 0) goto LAB_002f0b9a;
LAB_002f0ade:
        uVar9 = OffsetList::popMinimum(&local_68);
        local_b0 = local_b0 - uVar9;
      }
      local_ac = 0;
    }
    else {
      if ((int)uVar5 < 1) {
        uVar9 = 0;
        bVar28 = false;
      }
      else {
        local_38 = s + (int)local_a8;
        uVar18 = 0;
        uVar23 = 0;
        uVar9 = 0;
        do {
          bVar2 = this->spanLengths[uVar18];
          pvVar11 = UVector::elementAt(this->strings,(int32_t)uVar18);
          uVar3 = *(ushort *)((long)pvVar11 + 8);
          if ((uVar3 & 0x11) == 0) {
            if ((uVar3 & 2) == 0) {
              lVar12 = *(long *)((long)pvVar11 + 0x18);
            }
            else {
              lVar12 = (long)pvVar11 + 10;
            }
          }
          else {
            lVar12 = 0;
          }
          if ((short)uVar3 < 0) {
            uVar26 = *(uint *)((long)pvVar11 + 0xc);
          }
          else {
            uVar26 = (int)(short)uVar3 >> 5;
          }
          uVar24 = (uint)bVar2;
          if (0xfd < bVar2) {
            uVar24 = uVar26;
          }
          uVar6 = local_ac;
          if ((int)uVar24 < (int)local_ac) {
            uVar6 = uVar24;
          }
          uVar13 = uVar26 - uVar6;
          if (((int)uVar13 <= local_b0) && (iVar15 = (int)uVar23, iVar15 <= (int)uVar6)) {
            lVar14 = (long)(int)uVar26;
            if ((int)local_ac <= (int)uVar24) {
              uVar24 = local_ac;
            }
            pUVar21 = local_38 + -(long)(int)uVar24;
            uVar19 = (long)(int)uVar24;
            do {
              if (((long)iVar15 < (long)uVar19) || ((int)uVar9 < (int)uVar13)) {
                lVar25 = (long)(int)local_a8 - uVar19;
                pUVar1 = s + lVar25;
                lVar20 = 0;
                iVar22 = uVar26 + 1;
                do {
                  if (*(short *)((long)pUVar21 + lVar20) != *(short *)(lVar12 + lVar20))
                  goto LAB_002f0a05;
                  lVar20 = lVar20 + 2;
                  iVar22 = iVar22 + -1;
                } while (1 < iVar22);
                if ((((lVar25 < 1) || ((pUVar1[-1] & 0xfc00U) != 0xd800)) ||
                    ((*pUVar1 & 0xfc00U) != 0xdc00)) &&
                   (((local_40 - lVar14 <= lVar25 || ((pUVar1[lVar14 + -1] & 0xfc00U) != 0xd800)) ||
                    ((pUVar1[lVar14] & 0xfc00U) != 0xdc00)))) {
                  uVar23 = uVar19 & 0xffffffff;
                  uVar9 = uVar13;
                  break;
                }
              }
LAB_002f0a05:
              if (local_b0 <= (int)uVar13) break;
              uVar13 = uVar13 + 1;
              pUVar21 = pUVar21 + 1;
              bVar28 = (long)iVar15 < (long)uVar19;
              uVar19 = uVar19 - 1;
            } while (bVar28);
          }
          uVar18 = uVar18 + 1;
        } while (uVar18 != uVar5);
        bVar28 = (int)uVar23 != 0;
      }
      if ((uVar9 == 0) && (!bVar28)) goto LAB_002f0a5c;
      local_ac = 0;
      local_b0 = local_b0 - uVar9;
      if (local_b0 == 0) goto LAB_002f0b9a;
    }
LAB_002f0b61:
    local_a8 = local_a8 + uVar9;
  } while( true );
}

Assistant:

int32_t UnicodeSetStringSpan::span(const UChar *s, int32_t length, USetSpanCondition spanCondition) const {
    if(spanCondition==USET_SPAN_NOT_CONTAINED) {
        return spanNot(s, length);
    }
    int32_t spanLength=spanSet.span(s, length, USET_SPAN_CONTAINED);
    if(spanLength==length) {
        return length;
    }

    // Consider strings; they may overlap with the span.
    OffsetList offsets;
    if(spanCondition==USET_SPAN_CONTAINED) {
        // Use offset list to try all possibilities.
        offsets.setMaxLength(maxLength16);
    }
    int32_t pos=spanLength, rest=length-pos;
    int32_t i, stringsLength=strings.size();
    for(;;) {
        if(spanCondition==USET_SPAN_CONTAINED) {
            for(i=0; i<stringsLength; ++i) {
                int32_t overlap=spanLengths[i];
                if(overlap==ALL_CP_CONTAINED) {
                    continue;  // Irrelevant string.
                }
                const UnicodeString &string=*(const UnicodeString *)strings.elementAt(i);
                const UChar *s16=string.getBuffer();
                int32_t length16=string.length();

                // Try to match this string at pos-overlap..pos.
                if(overlap>=LONG_SPAN) {
                    overlap=length16;
                    // While contained: No point matching fully inside the code point span.
                    U16_BACK_1(s16, 0, overlap);  // Length of the string minus the last code point.
                }
                if(overlap>spanLength) {
                    overlap=spanLength;
                }
                int32_t inc=length16-overlap;  // Keep overlap+inc==length16.
                for(;;) {
                    if(inc>rest) {
                        break;
                    }
                    // Try to match if the increment is not listed already.
                    if(!offsets.containsOffset(inc) && matches16CPB(s, pos-overlap, length, s16, length16)) {
                        if(inc==rest) {
                            return length;  // Reached the end of the string.
                        }
                        offsets.addOffset(inc);
                    }
                    if(overlap==0) {
                        break;
                    }
                    --overlap;
                    ++inc;
                }
            }
        } else /* USET_SPAN_SIMPLE */ {
            int32_t maxInc=0, maxOverlap=0;
            for(i=0; i<stringsLength; ++i) {
                int32_t overlap=spanLengths[i];
                // For longest match, we do need to try to match even an all-contained string
                // to find the match from the earliest start.

                const UnicodeString &string=*(const UnicodeString *)strings.elementAt(i);
                const UChar *s16=string.getBuffer();
                int32_t length16=string.length();

                // Try to match this string at pos-overlap..pos.
                if(overlap>=LONG_SPAN) {
                    overlap=length16;
                    // Longest match: Need to match fully inside the code point span
                    // to find the match from the earliest start.
                }
                if(overlap>spanLength) {
                    overlap=spanLength;
                }
                int32_t inc=length16-overlap;  // Keep overlap+inc==length16.
                for(;;) {
                    if(inc>rest || overlap<maxOverlap) {
                        break;
                    }
                    // Try to match if the string is longer or starts earlier.
                    if( (overlap>maxOverlap || /* redundant overlap==maxOverlap && */ inc>maxInc) &&
                        matches16CPB(s, pos-overlap, length, s16, length16)
                    ) {
                        maxInc=inc;  // Longest match from earliest start.
                        maxOverlap=overlap;
                        break;
                    }
                    --overlap;
                    ++inc;
                }
            }

            if(maxInc!=0 || maxOverlap!=0) {
                // Longest-match algorithm, and there was a string match.
                // Simply continue after it.
                pos+=maxInc;
                rest-=maxInc;
                if(rest==0) {
                    return length;  // Reached the end of the string.
                }
                spanLength=0;  // Match strings from after a string match.
                continue;
            }
        }
        // Finished trying to match all strings at pos.

        if(spanLength!=0 || pos==0) {
            // The position is after an unlimited code point span (spanLength!=0),
            // not after a string match.
            // The only position where spanLength==0 after a span is pos==0.
            // Otherwise, an unlimited code point span is only tried again when no
            // strings match, and if such a non-initial span fails we stop.
            if(offsets.isEmpty()) {
                return pos;  // No strings matched after a span.
            }
            // Match strings from after the next string match.
        } else {
            // The position is after a string match (or a single code point).
            if(offsets.isEmpty()) {
                // No more strings matched after a previous string match.
                // Try another code point span from after the last string match.
                spanLength=spanSet.span(s+pos, rest, USET_SPAN_CONTAINED);
                if( spanLength==rest || // Reached the end of the string, or
                    spanLength==0       // neither strings nor span progressed.
                ) {
                    return pos+spanLength;
                }
                pos+=spanLength;
                rest-=spanLength;
                continue;  // spanLength>0: Match strings from after a span.
            } else {
                // Try to match only one code point from after a string match if some
                // string matched beyond it, so that we try all possible positions
                // and don't overshoot.
                spanLength=spanOne(spanSet, s+pos, rest);
                if(spanLength>0) {
                    if(spanLength==rest) {
                        return length;  // Reached the end of the string.
                    }
                    // Match strings after this code point.
                    // There cannot be any increments below it because UnicodeSet strings
                    // contain multiple code points.
                    pos+=spanLength;
                    rest-=spanLength;
                    offsets.shift(spanLength);
                    spanLength=0;
                    continue;  // Match strings from after a single code point.
                }
                // Match strings from after the next string match.
            }
        }
        int32_t minOffset=offsets.popMinimum();
        pos+=minOffset;
        rest-=minOffset;
        spanLength=0;  // Match strings from after a string match.
    }
}